

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O3

void __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_>::ComputeShape
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_> *this,TPZVec<double> *intpoint,
          TPZVec<double> *X,TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
          TPZFMatrix<double> *dphix)

{
  TPZGeoEl *this_00;
  
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  if (this_00 != (TPZGeoEl *)0x0) {
    TPZGeoEl::Jacobian(this_00,intpoint,jacobian,axes,detjac,jacinv);
    (**(code **)(*(long *)this_00 + 0x228))(this_00,intpoint,X);
    (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePiram>).
                           super_TPZIntelGen<pzshape::TPZShapePiram>.super_TPZInterpolatedElement.
                           super_TPZInterpolationSpace.super_TPZCompEl + 0x278))
              (this,intpoint,phi,dphi);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nERROR AT ",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>>::ComputeShape(TPZVec<REAL> &, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, REAL &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TCOMPEL = TPZCompElH1<pzshape::TPZShapePiram>]"
             ,0x121);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," - this->Reference() == NULL\n",0x1d);
  return;
}

Assistant:

inline void TPZCompElPostProc<TCOMPEL>::ComputeShape(TPZVec<REAL> &intpoint, TPZVec<REAL> &X,
                                                     TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,
                                                     REAL &detjac, TPZFMatrix<REAL> &jacinv,
                                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi, TPZFMatrix<REAL> &dphix){
    TPZGeoEl * ref = this->Reference();
    if (!ref){
        PZError << "\nERROR AT " << __PRETTY_FUNCTION__ << " - this->Reference() == NULL\n";
        return;
    }//if
    ref->Jacobian( intpoint, jacobian, axes, detjac , jacinv);
    
    ref->X(intpoint, X);
    //  this->Shape(intpoint,intpoint,phi,dphix);
    this->Shape(intpoint,phi,dphi);
    //this->Shape(intpoint,X,phi,dphix);
    
    //    ///axes is identity in discontinuous elements
    //    axes.Resize(dphix.Rows(), dphix.Rows());
    //    axes.Identity();
}